

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_schnorrsig_sign
              (secp256k1_context *ctx,uchar *sig64,uchar *msg32,secp256k1_keypair *keypair,
              secp256k1_nonce_function_hardened noncefp,void *ndata)

{
  uint *puVar1;
  uint *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar35;
  uint uVar36;
  uint uVar37;
  char cVar38;
  uint uVar39;
  int iVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  uchar *p;
  uint uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  code *pcVar60;
  undefined1 auVar61 [16];
  uchar buf [32];
  uchar pk_buf [32];
  secp256k1_scalar e;
  secp256k1_ge r;
  uint64_t l [8];
  secp256k1_ge pk;
  secp256k1_gej rj;
  secp256k1_scalar local_268;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  secp256k1_scalar local_228;
  uchar local_208 [40];
  secp256k1_scalar local_1e0;
  secp256k1_ge local_1c0;
  uchar local_168 [32];
  uint64_t local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  undefined1 local_118 [16];
  secp256k1_ge local_108;
  secp256k1_gej local_b0;
  
  local_238 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    secp256k1_schnorrsig_sign_cold_4();
  }
  else if (sig64 == (uchar *)0x0) {
    secp256k1_schnorrsig_sign_cold_3();
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_schnorrsig_sign_cold_2();
  }
  else {
    if (keypair != (secp256k1_keypair *)0x0) {
      pcVar60 = nonce_function_bip340;
      if (noncefp != (secp256k1_nonce_function_hardened)0x0) {
        pcVar60 = noncefp;
      }
      uVar39 = secp256k1_keypair_load(ctx,&local_268,&local_108,keypair);
      if (((byte)local_108.y.n[0] & 1) != 0) {
        secp256k1_scalar_negate(&local_268,&local_268);
      }
      secp256k1_scalar_get_b32(local_168,&local_268);
      secp256k1_fe_get_b32(local_208,&local_108.x);
      iVar40 = (*pcVar60)(local_248,msg32,local_168,local_208,"BIP0340/nonce",ndata);
      secp256k1_scalar_set_b32(&local_228,local_248,(int *)0x0);
      if (iVar40 == 0) {
        uVar39 = 0;
      }
      if (((local_228.d[1] == 0 && local_228.d[0] == 0) && local_228.d[2] == 0) &&
          local_228.d[3] == 0) {
        uVar39 = 0;
      }
      uVar48 = uVar39 ^ 1;
      uVar41 = (ulong)uVar48 - 1;
      local_228.d[0] = local_228.d[0] & uVar41 | (ulong)uVar48;
      local_228.d[1] = local_228.d[1] & uVar41;
      local_228.d[2] = local_228.d[2] & uVar41;
      local_228.d[3] = uVar41 & local_228.d[3];
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&local_b0,&local_228);
      secp256k1_ge_set_gej(&local_1c0,&local_b0);
      secp256k1_fe_normalize_var(&local_1c0.y);
      if (((byte)local_1c0.y.n[0] & 1) != 0) {
        secp256k1_scalar_negate(&local_228,&local_228);
      }
      secp256k1_fe_normalize_var(&local_1c0.x);
      secp256k1_fe_get_b32(sig64,&local_1c0.x);
      secp256k1_schnorrsig_challenge(&local_1e0,sig64,msg32,local_208);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_1e0.d[0];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_268.d[0];
      uVar43 = SUB168(auVar61 * auVar18,8);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar43;
      local_148 = SUB168(auVar61 * auVar18,0);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_1e0.d[0];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_268.d[1];
      auVar3 = auVar3 * auVar19;
      uVar49 = SUB168(auVar3 + auVar34,0);
      uVar54 = SUB168(auVar3 + auVar34,8);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_1e0.d[1];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_268.d[0];
      uVar44 = SUB168(auVar4 * auVar20,8);
      uVar41 = SUB168(auVar4 * auVar20,0);
      local_140 = uVar49 + uVar41;
      uVar41 = (ulong)CARRY8(uVar49,uVar41);
      uVar49 = uVar54 + uVar44;
      uVar55 = uVar49 + uVar41;
      uVar56 = (ulong)CARRY8(auVar3._8_8_,(ulong)CARRY8(uVar43,auVar3._0_8_)) +
               (ulong)(CARRY8(uVar54,uVar44) || CARRY8(uVar49,uVar41));
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_1e0.d[0];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_268.d[2];
      uVar45 = SUB168(auVar5 * auVar21,8);
      uVar41 = SUB168(auVar5 * auVar21,0);
      uVar43 = uVar55 + uVar41;
      uVar41 = (ulong)CARRY8(uVar55,uVar41);
      uVar44 = uVar56 + uVar45;
      uVar57 = uVar44 + uVar41;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_1e0.d[1];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_268.d[1];
      uVar46 = SUB168(auVar6 * auVar22,8);
      uVar49 = SUB168(auVar6 * auVar22,0);
      uVar55 = uVar43 + uVar49;
      uVar49 = (ulong)CARRY8(uVar43,uVar49);
      uVar54 = uVar57 + uVar46;
      uVar58 = uVar54 + uVar49;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_1e0.d[2];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_268.d[0];
      uVar47 = SUB168(auVar7 * auVar23,8);
      uVar43 = SUB168(auVar7 * auVar23,0);
      local_138 = uVar55 + uVar43;
      uVar43 = (ulong)CARRY8(uVar55,uVar43);
      uVar55 = uVar58 + uVar47;
      uVar59 = uVar55 + uVar43;
      uVar50 = (ulong)(CARRY8(uVar56,uVar45) || CARRY8(uVar44,uVar41)) +
               (ulong)(CARRY8(uVar57,uVar46) || CARRY8(uVar54,uVar49)) +
               (ulong)(CARRY8(uVar58,uVar47) || CARRY8(uVar55,uVar43));
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_1e0.d[0];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_268.d[3];
      uVar47 = SUB168(auVar8 * auVar24,8);
      uVar41 = SUB168(auVar8 * auVar24,0);
      uVar43 = uVar59 + uVar41;
      uVar41 = (ulong)CARRY8(uVar59,uVar41);
      uVar54 = uVar50 + uVar47;
      uVar59 = uVar54 + uVar41;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_1e0.d[1];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_268.d[2];
      uVar56 = SUB168(auVar9 * auVar25,8);
      uVar49 = SUB168(auVar9 * auVar25,0);
      uVar44 = uVar43 + uVar49;
      uVar49 = (ulong)CARRY8(uVar43,uVar49);
      uVar55 = uVar59 + uVar56;
      uVar51 = uVar55 + uVar49;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_1e0.d[2];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_268.d[1];
      uVar57 = SUB168(auVar10 * auVar26,8);
      uVar43 = SUB168(auVar10 * auVar26,0);
      uVar46 = uVar44 + uVar43;
      uVar43 = (ulong)CARRY8(uVar44,uVar43);
      uVar45 = uVar51 + uVar57;
      uVar52 = uVar45 + uVar43;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_1e0.d[3];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_268.d[0];
      uVar58 = SUB168(auVar11 * auVar27,8);
      uVar44 = SUB168(auVar11 * auVar27,0);
      local_130 = uVar46 + uVar44;
      uVar44 = (ulong)CARRY8(uVar46,uVar44);
      uVar46 = uVar52 + uVar58;
      uVar53 = uVar46 + uVar44;
      uVar56 = (ulong)(CARRY8(uVar50,uVar47) || CARRY8(uVar54,uVar41)) +
               (ulong)(CARRY8(uVar59,uVar56) || CARRY8(uVar55,uVar49)) +
               (ulong)(CARRY8(uVar51,uVar57) || CARRY8(uVar45,uVar43)) +
               (ulong)(CARRY8(uVar52,uVar58) || CARRY8(uVar46,uVar44));
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_1e0.d[1];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_268.d[3];
      uVar45 = SUB168(auVar12 * auVar28,8);
      uVar41 = SUB168(auVar12 * auVar28,0);
      uVar43 = uVar53 + uVar41;
      uVar41 = (ulong)CARRY8(uVar53,uVar41);
      uVar44 = uVar56 + uVar45;
      uVar57 = uVar44 + uVar41;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_1e0.d[2];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_268.d[2];
      uVar46 = SUB168(auVar13 * auVar29,8);
      uVar49 = SUB168(auVar13 * auVar29,0);
      uVar55 = uVar43 + uVar49;
      uVar49 = (ulong)CARRY8(uVar43,uVar49);
      uVar54 = uVar57 + uVar46;
      uVar58 = uVar54 + uVar49;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_1e0.d[3];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_268.d[1];
      uVar47 = SUB168(auVar14 * auVar30,8);
      uVar43 = SUB168(auVar14 * auVar30,0);
      local_128 = uVar55 + uVar43;
      uVar43 = (ulong)CARRY8(uVar55,uVar43);
      uVar55 = uVar58 + uVar47;
      uVar50 = uVar55 + uVar43;
      uVar45 = (ulong)(CARRY8(uVar56,uVar45) || CARRY8(uVar44,uVar41)) +
               (ulong)(CARRY8(uVar57,uVar46) || CARRY8(uVar54,uVar49)) +
               (ulong)(CARRY8(uVar58,uVar47) || CARRY8(uVar55,uVar43));
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_1e0.d[2];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_268.d[3];
      uVar54 = SUB168(auVar15 * auVar31,8);
      uVar41 = SUB168(auVar15 * auVar31,0);
      uVar44 = uVar50 + uVar41;
      uVar41 = (ulong)CARRY8(uVar50,uVar41);
      uVar43 = uVar45 + uVar54;
      uVar46 = uVar43 + uVar41;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_1e0.d[3];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_268.d[2];
      uVar55 = SUB168(auVar16 * auVar32,8);
      uVar49 = SUB168(auVar16 * auVar32,0);
      local_120 = uVar44 + uVar49;
      uVar49 = (ulong)CARRY8(uVar44,uVar49);
      uVar44 = uVar46 + uVar55;
      local_118._8_8_ =
           (ulong)(CARRY8(uVar45,uVar54) || CARRY8(uVar43,uVar41)) +
           (ulong)(CARRY8(uVar46,uVar55) || CARRY8(uVar44,uVar49));
      local_118._0_8_ = uVar44 + uVar49;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_1e0.d[3];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_268.d[3];
      local_118 = auVar17 * auVar33 + local_118;
      secp256k1_scalar_reduce_512(&local_1e0,&local_148);
      secp256k1_scalar_add(&local_1e0,&local_1e0,&local_228);
      secp256k1_scalar_get_b32(sig64 + 0x20,&local_1e0);
      cVar38 = (char)uVar48 + -1;
      auVar61 = ZEXT216(CONCAT11(cVar38,cVar38));
      auVar61 = pshuflw(auVar61,auVar61,0);
      uVar48 = auVar61._0_4_;
      lVar42 = 0;
      do {
        puVar1 = (uint *)(sig64 + lVar42);
        uVar35 = puVar1[1];
        uVar36 = puVar1[2];
        uVar37 = puVar1[3];
        puVar2 = (uint *)(sig64 + lVar42);
        *puVar2 = *puVar1 & uVar48;
        puVar2[1] = uVar35 & uVar48;
        puVar2[2] = uVar36 & uVar48;
        puVar2[3] = uVar37 & uVar48;
        lVar42 = lVar42 + 0x10;
      } while (lVar42 != 0x40);
      return uVar39;
    }
    secp256k1_schnorrsig_sign_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_schnorrsig_sign(const secp256k1_context* ctx, unsigned char *sig64, const unsigned char *msg32, const secp256k1_keypair *keypair, secp256k1_nonce_function_hardened noncefp, void *ndata) {
    secp256k1_scalar sk;
    secp256k1_scalar e;
    secp256k1_scalar k;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_ge r;
    unsigned char buf[32] = { 0 };
    unsigned char pk_buf[32];
    unsigned char seckey[32];
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(keypair != NULL);

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_bip340;
    }

    ret &= secp256k1_keypair_load(ctx, &sk, &pk, keypair);
    /* Because we are signing for a x-only pubkey, the secret key is negated
     * before signing if the point corresponding to the secret key does not
     * have an even Y. */
    if (secp256k1_fe_is_odd(&pk.y)) {
        secp256k1_scalar_negate(&sk, &sk);
    }

    secp256k1_scalar_get_b32(seckey, &sk);
    secp256k1_fe_get_b32(pk_buf, &pk.x);
    ret &= !!noncefp(buf, msg32, seckey, pk_buf, bip340_algo16, ndata);
    secp256k1_scalar_set_b32(&k, buf, NULL);
    ret &= !secp256k1_scalar_is_zero(&k);
    secp256k1_scalar_cmov(&k, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rj, &k);
    secp256k1_ge_set_gej(&r, &rj);

    /* We declassify r to allow using it as a branch point. This is fine
     * because r is not a secret. */
    secp256k1_declassify(ctx, &r, sizeof(r));
    secp256k1_fe_normalize_var(&r.y);
    if (secp256k1_fe_is_odd(&r.y)) {
        secp256k1_scalar_negate(&k, &k);
    }
    secp256k1_fe_normalize_var(&r.x);
    secp256k1_fe_get_b32(&sig64[0], &r.x);

    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg32, pk_buf);
    secp256k1_scalar_mul(&e, &e, &sk);
    secp256k1_scalar_add(&e, &e, &k);
    secp256k1_scalar_get_b32(&sig64[32], &e);

    secp256k1_memczero(sig64, 64, !ret);
    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);
    memset(seckey, 0, sizeof(seckey));

    return ret;
}